

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::HeapprofdConfig::HeapprofdConfig(HeapprofdConfig *this)

{
  HeapprofdConfig *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__HeapprofdConfig_009c1420;
  this->sampling_interval_bytes_ = 0;
  this->adaptive_sampling_shmem_threshold_ = 0;
  this->adaptive_sampling_max_sampling_interval_bytes_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->process_cmdline_);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->pid_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->target_installed_by_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->heaps_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->exclude_heaps_);
  this->stream_allocations_ = false;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &this->heap_sampling_intervals_);
  this->all_heaps_ = false;
  this->all_ = false;
  this->min_anonymous_memory_kb_ = 0;
  this->max_heapprofd_memory_kb_ = 0;
  this->max_heapprofd_cpu_secs_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->skip_symbol_prefix_);
  protozero::CopyablePtr<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig>::CopyablePtr
            (&this->continuous_dump_config_);
  this->shmem_size_bytes_ = 0;
  this->block_client_ = false;
  this->block_client_timeout_us_ = 0;
  this->no_startup_ = false;
  this->no_running_ = false;
  this->dump_at_max_ = false;
  this->disable_fork_teardown_ = false;
  this->disable_vfork_detection_ = false;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<28UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

HeapprofdConfig::HeapprofdConfig() = default;